

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O3

void Cmd_get(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  char *pcVar2;
  FBaseCVar *pFVar3;
  undefined4 extraout_var;
  FBaseCVar *prev;
  FBaseCVar *pFStack_18;
  
  iVar1 = FCommandLine::argc(argv);
  if (1 < iVar1) {
    pcVar2 = FCommandLine::operator[](argv,1);
    pFVar3 = FindCVar(pcVar2,&pFStack_18);
    if (pFVar3 == (FBaseCVar *)0x0) {
      pcVar2 = FCommandLine::operator[](argv,1);
      Printf("\"%s\" is unset\n",pcVar2);
    }
    else {
      iVar1 = (*pFVar3->_vptr_FBaseCVar[4])(pFVar3,3);
      Printf("\"%s\" is \"%s\"\n",pFVar3->Name,CONCAT44(extraout_var,iVar1));
    }
    return;
  }
  Printf("get: need variable name\n");
  return;
}

Assistant:

CCMD (get)
{
	FBaseCVar *var, *prev;

	if (argv.argc() >= 2)
	{
		if ( (var = FindCVar (argv[1], &prev)) )
		{
			UCVarValue val;
			val = var->GetGenericRep (CVAR_String);
			Printf ("\"%s\" is \"%s\"\n", var->GetName(), val.String);
		}
		else
		{
			Printf ("\"%s\" is unset\n", argv[1]);
		}
	}
	else
	{
		Printf ("get: need variable name\n");
	}
}